

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O0

void Gia_LutDelayTraceSortPins(Gia_Man_t *p,int iObj,int *pPinPerm,float *pPinDelays)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  float fVar4;
  int local_38;
  int temp;
  int best_i;
  int j;
  int i;
  int iFanin;
  float *pPinDelays_local;
  int *pPinPerm_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsLut(p,iObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsLut(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSpeedup.c"
                  ,0x31,"void Gia_LutDelayTraceSortPins(Gia_Man_t *, int, int *, float *)");
  }
  for (best_i = 0; iVar1 = Gia_ObjLutSize(p,iObj), best_i < iVar1; best_i = best_i + 1) {
    piVar3 = Gia_ObjLutFanins(p,iObj);
    iVar1 = piVar3[best_i];
    pPinPerm[best_i] = best_i;
    fVar4 = Gia_ObjTimeArrival(p,iVar1);
    pPinDelays[best_i] = fVar4;
  }
  for (best_i = 0; iVar1 = Gia_ObjLutSize(p,iObj), best_i < iVar1 + -1; best_i = best_i + 1) {
    local_38 = best_i;
    temp = best_i;
    while( true ) {
      temp = temp + 1;
      iVar1 = Gia_ObjLutSize(p,iObj);
      if (iVar1 <= temp) break;
      if (pPinDelays[pPinPerm[local_38]] <= pPinDelays[pPinPerm[temp]] &&
          pPinDelays[pPinPerm[temp]] != pPinDelays[pPinPerm[local_38]]) {
        local_38 = temp;
      }
    }
    if (local_38 != best_i) {
      iVar1 = pPinPerm[best_i];
      pPinPerm[best_i] = pPinPerm[local_38];
      pPinPerm[local_38] = iVar1;
    }
  }
  iVar1 = Gia_ObjLutSize(p,iObj);
  if ((iVar1 != 0) && (iVar1 = *pPinPerm, iVar2 = Gia_ObjLutSize(p,iObj), iVar2 <= iVar1)) {
    __assert_fail("Gia_ObjLutSize(p, iObj) == 0 || pPinPerm[0] < Gia_ObjLutSize(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSpeedup.c"
                  ,0x47,"void Gia_LutDelayTraceSortPins(Gia_Man_t *, int, int *, float *)");
  }
  best_i = 1;
  while( true ) {
    iVar1 = Gia_ObjLutSize(p,iObj);
    if (iVar1 <= best_i) {
      return;
    }
    iVar1 = pPinPerm[best_i];
    iVar2 = Gia_ObjLutSize(p,iObj);
    if (iVar2 <= iVar1) break;
    if (pPinDelays[pPinPerm[best_i + -1]] < pPinDelays[pPinPerm[best_i]]) {
      __assert_fail("pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSpeedup.c"
                    ,0x4b,"void Gia_LutDelayTraceSortPins(Gia_Man_t *, int, int *, float *)");
    }
    best_i = best_i + 1;
  }
  __assert_fail("pPinPerm[i] < Gia_ObjLutSize(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSpeedup.c"
                ,0x4a,"void Gia_LutDelayTraceSortPins(Gia_Man_t *, int, int *, float *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Sorts the pins in the decreasing order of delays.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_LutDelayTraceSortPins( Gia_Man_t * p, int iObj, int * pPinPerm, float * pPinDelays )
{
    int iFanin, i, j, best_i, temp;
    assert( Gia_ObjIsLut(p, iObj) );
    // start the trivial permutation and collect pin delays
    Gia_LutForEachFanin( p, iObj, iFanin, i )
    {
        pPinPerm[i] = i;
        pPinDelays[i] = Gia_ObjTimeArrival(p, iFanin);
    }
    // selection sort the pins in the decreasible order of delays
    // this order will match the increasing order of LUT input pins
    for ( i = 0; i < Gia_ObjLutSize(p, iObj)-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < Gia_ObjLutSize(p, iObj); j++ )
            if ( pPinDelays[pPinPerm[j]] > pPinDelays[pPinPerm[best_i]] )
                best_i = j;
        if ( best_i == i )
            continue;
        temp = pPinPerm[i]; 
        pPinPerm[i] = pPinPerm[best_i]; 
        pPinPerm[best_i] = temp;
    }
    // verify
    assert( Gia_ObjLutSize(p, iObj) == 0 || pPinPerm[0] < Gia_ObjLutSize(p, iObj) );
    for ( i = 1; i < Gia_ObjLutSize(p, iObj); i++ )
    {
        assert( pPinPerm[i] < Gia_ObjLutSize(p, iObj) );
        assert( pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]] );
    }
}